

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

Expression * __thiscall
anon_unknown.dwarf_aea87::AssertionEmitter::translateInvoke
          (AssertionEmitter *this,InvokeAction *invoke,Module *wasm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  InvokeAction *pIVar1;
  Call *pCVar2;
  undefined8 *puVar3;
  Type type;
  long lVar4;
  Literal *pLVar5;
  char *pcVar6;
  size_t sVar7;
  Iterator IVar8;
  Name NVar9;
  Name NVar10;
  Literal local_90;
  Expression *local_78;
  size_t local_70;
  Literal *local_68;
  InvokeAction *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Builder local_38;
  Builder builder;
  
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00 = &(this->flags).symbolsFile.field_2;
  local_60 = invoke;
  local_38.wasm = (Module *)invoke;
  IVar8 = ::wasm::SmallVector<wasm::Literal,_1UL>::end
                    ((SmallVector<wasm::Literal,_1UL> *)this_00->_M_local_buf);
  local_70 = IVar8.
             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
             .index;
  local_68 = (Literal *)((long)&(this->flags).symbolsFile.field_2 + 8);
  lVar4 = -0x18;
  for (sVar7 = 0; pIVar1 = local_60,
      local_70 != sVar7 ||
      (SmallVector<wasm::Literal,_1UL> *)this_00 !=
      IVar8.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .parent; sVar7 = sVar7 + 1) {
    pLVar5 = (Literal *)(*(long *)&(this->options).super_Options.extra._M_t._M_impl + lVar4);
    if (sVar7 == 0) {
      pLVar5 = local_68;
    }
    ::wasm::Literal::Literal(&local_90,pLVar5);
    local_78 = ::wasm::Builder::makeConstantExpression(&local_38,&local_90);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,&local_78);
    ::wasm::Literal::~Literal(&local_90);
    lVar4 = lVar4 + 0x18;
  }
  NVar9.super_IString.str._M_str = (this->flags).symbolsFile._M_dataplus._M_p;
  NVar9.super_IString.str._M_len = (size_t)local_60;
  lVar4 = ::wasm::Module::getExport(NVar9);
  pcVar6 = (char *)0x0;
  if (*(int *)(lVar4 + 0x10) == 0) {
    puVar3 = (undefined8 *)0x0;
    if (*(char *)(lVar4 + 0x28) == '\0') {
      puVar3 = (undefined8 *)(lVar4 + 0x18);
    }
    pcVar6 = (char *)*puVar3;
  }
  NVar10.super_IString.str._M_str = pcVar6;
  NVar10.super_IString.str._M_len = (size_t)pIVar1;
  ::wasm::Module::getFunction(NVar10);
  ::wasm::HeapType::getSignature();
  pCVar2 = ::wasm::Builder::makeCall
                     (&local_38,(IString)*(IString *)&(this->flags).symbolsFile,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58,
                      type,false);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  return (Expression *)pCVar2;
}

Assistant:

Expression* AssertionEmitter::translateInvoke(InvokeAction& invoke,
                                              Module& wasm) {
  std::vector<Expression*> args;
  Builder builder(wasm);
  for (auto& arg : invoke.args) {
    args.push_back(builder.makeConstantExpression(arg));
  }
  Export* exp = wasm.getExport(invoke.name);
  Type type = wasm
                .getFunction((exp->kind == ExternalKind::Function)
                               ? *exp->getInternalName()
                               : Name())
                ->getResults();
  return builder.makeCall(invoke.name, args, type);
}